

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_call_before_frame_send(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  int rv;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if ((session->callbacks).before_frame_send_callback != (nghttp2_before_frame_send_callback)0x0) {
    iVar1 = (*(session->callbacks).before_frame_send_callback)(session,frame,session->user_data);
    if (iVar1 == -0x217) {
      return -0x217;
    }
    if (iVar1 != 0) {
      return -0x386;
    }
  }
  return 0;
}

Assistant:

static int session_call_before_frame_send(nghttp2_session *session,
                                          nghttp2_frame *frame) {
  int rv;
  if (session->callbacks.before_frame_send_callback) {
    rv = session->callbacks.before_frame_send_callback(session, frame,
                                                       session->user_data);
    if (rv == NGHTTP2_ERR_CANCEL) {
      return rv;
    }

    if (rv != 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
  return 0;
}